

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O0

bool duckdb::ParquetWriteRotateNextFile
               (GlobalFunctionData *gstate,FunctionData *bind_data_p,optional_idx *file_size_bytes)

{
  bool bVar1;
  ParquetWriteBindData *pPVar2;
  idx_t iVar3;
  idx_t iVar4;
  optional_idx *in_RDX;
  optional_idx *unaff_retaddr;
  ParquetWriteBindData *bind_data;
  ParquetWriteGlobalState *global_state;
  FunctionData *in_stack_ffffffffffffffc0;
  
  GlobalFunctionData::Cast<duckdb::ParquetWriteGlobalState>
            ((GlobalFunctionData *)in_stack_ffffffffffffffc0);
  pPVar2 = FunctionData::Cast<duckdb::ParquetWriteBindData>(in_stack_ffffffffffffffc0);
  bVar1 = optional_idx::IsValid(in_RDX);
  if (bVar1) {
    unique_ptr<duckdb::ParquetWriter,_std::default_delete<duckdb::ParquetWriter>,_true>::operator->
              ((unique_ptr<duckdb::ParquetWriter,_std::default_delete<duckdb::ParquetWriter>,_true>
                *)in_stack_ffffffffffffffc0);
    iVar3 = ParquetWriter::FileSize((ParquetWriter *)0x62ec07);
    iVar4 = optional_idx::GetIndex(unaff_retaddr);
    if (iVar4 < iVar3) {
      return true;
    }
  }
  bVar1 = optional_idx::IsValid(&pPVar2->row_groups_per_file);
  if (bVar1) {
    unique_ptr<duckdb::ParquetWriter,_std::default_delete<duckdb::ParquetWriter>,_true>::operator->
              ((unique_ptr<duckdb::ParquetWriter,_std::default_delete<duckdb::ParquetWriter>,_true>
                *)in_stack_ffffffffffffffc0);
    iVar3 = ParquetWriter::NumberOfRowGroups((ParquetWriter *)0x62ec57);
    iVar4 = optional_idx::GetIndex(unaff_retaddr);
    if (iVar4 <= iVar3) {
      return true;
    }
  }
  return false;
}

Assistant:

bool ParquetWriteRotateNextFile(GlobalFunctionData &gstate, FunctionData &bind_data_p,
                                const optional_idx &file_size_bytes) {
	auto &global_state = gstate.Cast<ParquetWriteGlobalState>();
	auto &bind_data = bind_data_p.Cast<ParquetWriteBindData>();
	if (file_size_bytes.IsValid() && global_state.writer->FileSize() > file_size_bytes.GetIndex()) {
		return true;
	}
	if (bind_data.row_groups_per_file.IsValid() &&
	    global_state.writer->NumberOfRowGroups() >= bind_data.row_groups_per_file.GetIndex()) {
		return true;
	}
	return false;
}